

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

void FindActions(lemon *lemp)

{
  uint uVar1;
  uint uVar2;
  e_assoc eVar3;
  state *psVar4;
  config *pcVar5;
  symbol *psVar6;
  rule *prVar7;
  symbol *psVar8;
  action *paVar9;
  action *paVar10;
  ulong uVar11;
  rule **pprVar12;
  ulong uVar13;
  action *paVar14;
  action **ppaVar15;
  int iVar16;
  e_action eVar17;
  config **ppcVar18;
  long lVar19;
  long lVar20;
  rule **pprVar21;
  
  for (lVar20 = 0; lVar20 < lemp->nstate; lVar20 = lVar20 + 1) {
    psVar4 = lemp->sorted[lVar20];
    ppcVar18 = &psVar4->cfp;
    while (pcVar5 = *ppcVar18, pcVar5 != (config *)0x0) {
      if (pcVar5->rp->nrhs == pcVar5->dot) {
        for (lVar19 = 0; lVar19 < lemp->nterminal; lVar19 = lVar19 + 1) {
          if (pcVar5->fws[lVar19] != '\0') {
            Action_add(&psVar4->ap,REDUCE,lemp->symbols[lVar19],(char *)pcVar5->rp);
          }
        }
      }
      ppcVar18 = &pcVar5->next;
    }
  }
  if ((lemp->start == (char *)0x0) || (psVar8 = Symbol_find(lemp->start), psVar8 == (symbol *)0x0))
  {
    psVar8 = lemp->startRule->lhs;
  }
  lVar20 = 0;
  Action_add(&(*lemp->sorted)->ap,ACCEPT,psVar8,(char *)0x0);
  do {
    uVar1 = lemp->nstate;
    if ((int)uVar1 <= lVar20) {
      pprVar21 = &lemp->rule;
      pprVar12 = pprVar21;
      while (prVar7 = *pprVar12, prVar7 != (rule *)0x0) {
        prVar7->canReduce = LEMON_FALSE;
        pprVar12 = &prVar7->next;
      }
      uVar13 = 0;
      uVar11 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar11 = uVar13;
      }
      for (; uVar13 != uVar11; uVar13 = uVar13 + 1) {
        ppaVar15 = &lemp->sorted[uVar13]->ap;
        while (paVar9 = *ppaVar15, paVar9 != (action *)0x0) {
          if (paVar9->type == REDUCE) {
            ((paVar9->x).rp)->canReduce = LEMON_TRUE;
          }
          ppaVar15 = &paVar9->next;
        }
      }
      while (prVar7 = *pprVar21, prVar7 != (rule *)0x0) {
        if (prVar7->canReduce == LEMON_FALSE) {
          ErrorMsg(lemp->filename,prVar7->ruleline,"This rule can not be reduced.\n");
          lemp->errorcnt = lemp->errorcnt + 1;
        }
        pprVar21 = &prVar7->next;
      }
      return;
    }
    psVar4 = lemp->sorted[lVar20];
    paVar9 = Action_sort(psVar4->ap);
    psVar4->ap = paVar9;
    while ((paVar10 = paVar9, paVar10 != (action *)0x0 &&
           (paVar9 = paVar10->next, paVar14 = paVar9, paVar9 != (action *)0x0))) {
      for (; (paVar14 != (action *)0x0 && (psVar8 = paVar10->sp, paVar14->sp == psVar8));
          paVar14 = paVar14->next) {
        eVar17 = paVar10->type;
        iVar16 = 0;
        if (eVar17 == SHIFT) {
          eVar17 = paVar14->type;
          if (eVar17 == REDUCE) {
            psVar6 = ((paVar14->x).rp)->precsym;
            if (((psVar6 == (symbol *)0x0) || (uVar1 = psVar8->prec, (int)uVar1 < 0)) ||
               (uVar2 = psVar6->prec, (int)uVar2 < 0)) {
              paVar14->type = SRCONFLICT;
              iVar16 = 1;
            }
            else {
              if (uVar2 < uVar1) {
LAB_001048ff:
                paVar14->type = RD_RESOLVED;
              }
              else if ((uVar1 < uVar2) || (eVar3 = psVar8->assoc, eVar3 == LEFT)) {
                paVar10->type = SH_RESOLVED;
              }
              else {
                if (eVar3 != NONE) {
                  if (eVar3 != RIGHT) {
                    __assert_fail("spx->prec==spy->prec && spx->assoc==NONE",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/tools/lemon/lemon.c"
                                  ,0x45a,"int resolve_conflict(struct action *, struct action *)");
                  }
                  goto LAB_001048ff;
                }
                paVar14->type = ERROR;
              }
              iVar16 = 0;
            }
          }
          else {
            iVar16 = 0;
            if (eVar17 != SHIFT) goto LAB_001048c3;
            paVar14->type = SSCONFLICT;
            eVar17 = paVar10->type;
            iVar16 = 1;
            if (eVar17 != SHIFT) goto LAB_00104838;
          }
        }
        else {
LAB_00104838:
          if (eVar17 == REDUCE) {
            eVar17 = paVar14->type;
            if (eVar17 == REDUCE) {
              psVar8 = ((paVar10->x).rp)->precsym;
              if (((psVar8 == (symbol *)0x0) ||
                  (psVar6 = ((paVar14->x).rp)->precsym, psVar6 == (symbol *)0x0)) ||
                 ((uVar1 = psVar8->prec, (int)uVar1 < 0 ||
                  ((uVar2 = psVar6->prec, (int)uVar2 < 0 || (uVar1 == uVar2)))))) {
                paVar14->type = RRCONFLICT;
                iVar16 = iVar16 + 1;
              }
              else if (uVar2 < uVar1) {
                paVar14->type = RD_RESOLVED;
              }
              else if (uVar1 < uVar2) {
                paVar10->type = RD_RESOLVED;
              }
            }
            else {
LAB_001048c3:
              if (4 < eVar17 - SSCONFLICT) {
                __assert_fail("apx->type==SH_RESOLVED || apx->type==RD_RESOLVED || apx->type==SSCONFLICT || apx->type==SRCONFLICT || apx->type==RRCONFLICT || apy->type==SH_RESOLVED || apy->type==RD_RESOLVED || apy->type==SSCONFLICT || apy->type==SRCONFLICT || apy->type==RRCONFLICT"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/tools/lemon/lemon.c"
                              ,0x475,"int resolve_conflict(struct action *, struct action *)");
              }
            }
          }
          else if (4 < eVar17 - SSCONFLICT) {
            eVar17 = paVar14->type;
            goto LAB_001048c3;
          }
        }
        lemp->nconflict = lemp->nconflict + iVar16;
      }
    }
    lVar20 = lVar20 + 1;
  } while( true );
}

Assistant:

void FindActions(struct lemon *lemp)
{
  int i,j;
  struct config *cfp;
  struct state *stp;
  struct symbol *sp;
  struct rule *rp;

  /* Add all of the reduce actions 
  ** A reduce action is added for each element of the followset of
  ** a configuration which has its dot at the extreme right.
  */
  for(i=0; i<lemp->nstate; i++){   /* Loop over all states */
    stp = lemp->sorted[i];
    for(cfp=stp->cfp; cfp; cfp=cfp->next){  /* Loop over all configurations */
      if( cfp->rp->nrhs==cfp->dot ){        /* Is dot at extreme right? */
        for(j=0; j<lemp->nterminal; j++){
          if( SetFind(cfp->fws,j) ){
            /* Add a reduce action to the state "stp" which will reduce by the
            ** rule "cfp->rp" if the lookahead symbol is "lemp->symbols[j]" */
            Action_add(&stp->ap,REDUCE,lemp->symbols[j],(char *)cfp->rp);
          }
	}
      }
    }
  }

  /* Add the accepting token */
  if( lemp->start ){
    sp = Symbol_find(lemp->start);
    if( sp==0 ) sp = lemp->startRule->lhs;
  }else{
    sp = lemp->startRule->lhs;
  }
  /* Add to the first state (which is always the starting state of the
  ** finite state machine) an action to ACCEPT if the lookahead is the
  ** start nonterminal.  */
  Action_add(&lemp->sorted[0]->ap,ACCEPT,sp,0);

  /* Resolve conflicts */
  for(i=0; i<lemp->nstate; i++){
    struct action *ap, *nap;
    struct state *stp;
    stp = lemp->sorted[i];
    /* assert( stp->ap ); */
    stp->ap = Action_sort(stp->ap);
    for(ap=stp->ap; ap && ap->next; ap=ap->next){
      for(nap=ap->next; nap && nap->sp==ap->sp; nap=nap->next){
         /* The two actions "ap" and "nap" have the same lookahead.
         ** Figure out which one should be used */
         lemp->nconflict += resolve_conflict(ap,nap);
      }
    }
  }

  /* Report an error for each rule that can never be reduced. */
  for(rp=lemp->rule; rp; rp=rp->next) rp->canReduce = LEMON_FALSE;
  for(i=0; i<lemp->nstate; i++){
    struct action *ap;
    for(ap=lemp->sorted[i]->ap; ap; ap=ap->next){
      if( ap->type==REDUCE ) ap->x.rp->canReduce = LEMON_TRUE;
    }
  }
  for(rp=lemp->rule; rp; rp=rp->next){
    if( rp->canReduce ) continue;
    ErrorMsg(lemp->filename,rp->ruleline,"This rule can not be reduced.\n");
    lemp->errorcnt++;
  }
}